

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall TArray<FString,_FString>::Find(TArray<FString,_FString> *this,FString *item)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = 0;
  for (uVar3 = 0; uVar3 < this->Count; uVar3 = uVar3 + 1) {
    bVar1 = FString::operator==((FString *)((long)&this->Array->Chars + lVar2),item);
    if (bVar1) break;
    lVar2 = lVar2 + 8;
  }
  return (uint)uVar3;
}

Assistant:

unsigned int Find(const T& item) const
    {
        unsigned int i;
        for(i = 0;i < Count;++i)
        {
            if(Array[i] == item)
                break;
        }
        return i;
    }